

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  bool bVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  char cVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar45;
  float fVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  float fVar59;
  float fVar63;
  float fVar64;
  vint4 ai_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  vint4 bi;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  vint4 ai_3;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  NodeRef stack [244];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar29 = local_7d0;
  local_7d8 = root.ptr;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar13 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar14 = (tray->tnear).field_0.i[k];
  iVar15 = (tray->tfar).field_0.i[k];
LAB_00286b72:
  do {
    bVar17 = puVar29 != &local_7d8;
    if (puVar29 == &local_7d8) {
      return bVar17;
    }
    uVar28 = puVar29[-1];
    puVar29 = puVar29 + -1;
    while ((uVar28 & 8) == 0) {
      fVar16 = *(float *)(ray + k * 4 + 0x70);
      uVar25 = (uint)uVar28 & 7;
      uVar24 = uVar28 & 0xfffffffffffffff0;
      if (uVar25 == 3) {
        fVar69 = 1.0 - fVar16;
        fVar70 = fVar69 * 0.0;
        auVar85._0_4_ =
             fVar8 * *(float *)(uVar24 + 0x20) +
             fVar9 * *(float *)(uVar24 + 0x50) + fVar10 * *(float *)(uVar24 + 0x80);
        auVar85._4_4_ =
             fVar8 * *(float *)(uVar24 + 0x24) +
             fVar9 * *(float *)(uVar24 + 0x54) + fVar10 * *(float *)(uVar24 + 0x84);
        auVar85._8_4_ =
             fVar8 * *(float *)(uVar24 + 0x28) +
             fVar9 * *(float *)(uVar24 + 0x58) + fVar10 * *(float *)(uVar24 + 0x88);
        auVar85._12_4_ =
             fVar8 * *(float *)(uVar24 + 0x2c) +
             fVar9 * *(float *)(uVar24 + 0x5c) + fVar10 * *(float *)(uVar24 + 0x8c);
        fVar73 = (float)DAT_01f80d30;
        fVar74 = DAT_01f80d30._4_4_;
        fVar75 = DAT_01f80d30._8_4_;
        fVar76 = DAT_01f80d30._12_4_;
        auVar67._4_4_ = -(uint)(ABS(auVar85._4_4_) < fVar74);
        auVar67._0_4_ = -(uint)(ABS(auVar85._0_4_) < fVar73);
        auVar67._8_4_ = -(uint)(ABS(auVar85._8_4_) < fVar75);
        auVar67._12_4_ = -(uint)(ABS(auVar85._12_4_) < fVar76);
        auVar86 = blendvps(auVar85,_DAT_01f80d30,auVar67);
        local_918 = (float)*(undefined8 *)(uVar24 + 0x30);
        fStack_914 = (float)((ulong)*(undefined8 *)(uVar24 + 0x30) >> 0x20);
        fStack_910 = (float)*(undefined8 *)(uVar24 + 0x38);
        fStack_90c = (float)((ulong)*(undefined8 *)(uVar24 + 0x38) >> 0x20);
        auVar61._0_4_ =
             fVar8 * local_918 +
             fVar9 * *(float *)(uVar24 + 0x60) + fVar10 * *(float *)(uVar24 + 0x90);
        auVar61._4_4_ =
             fVar8 * fStack_914 +
             fVar9 * *(float *)(uVar24 + 100) + fVar10 * *(float *)(uVar24 + 0x94);
        auVar61._8_4_ =
             fVar8 * fStack_910 +
             fVar9 * *(float *)(uVar24 + 0x68) + fVar10 * *(float *)(uVar24 + 0x98);
        auVar61._12_4_ =
             fVar8 * fStack_90c +
             fVar9 * *(float *)(uVar24 + 0x6c) + fVar10 * *(float *)(uVar24 + 0x9c);
        auVar72._4_4_ = -(uint)(ABS(auVar61._4_4_) < fVar74);
        auVar72._0_4_ = -(uint)(ABS(auVar61._0_4_) < fVar73);
        auVar72._8_4_ = -(uint)(ABS(auVar61._8_4_) < fVar75);
        auVar72._12_4_ = -(uint)(ABS(auVar61._12_4_) < fVar76);
        auVar67 = blendvps(auVar61,_DAT_01f80d30,auVar72);
        auVar55._4_4_ = iVar14;
        auVar55._0_4_ = iVar14;
        auVar55._8_4_ = iVar14;
        auVar55._12_4_ = iVar14;
        local_868 = (float)*(undefined8 *)(uVar24 + 0xa0);
        fStack_864 = (float)((ulong)*(undefined8 *)(uVar24 + 0xa0) >> 0x20);
        fStack_860 = (float)*(undefined8 *)(uVar24 + 0xa8);
        fStack_85c = (float)((ulong)*(undefined8 *)(uVar24 + 0xa8) >> 0x20);
        auVar42._0_4_ =
             fVar8 * *(float *)(uVar24 + 0x40) +
             fVar9 * *(float *)(uVar24 + 0x70) + fVar10 * local_868;
        auVar42._4_4_ =
             fVar8 * *(float *)(uVar24 + 0x44) +
             fVar9 * *(float *)(uVar24 + 0x74) + fVar10 * fStack_864;
        auVar42._8_4_ =
             fVar8 * *(float *)(uVar24 + 0x48) +
             fVar9 * *(float *)(uVar24 + 0x78) + fVar10 * fStack_860;
        auVar42._12_4_ =
             fVar8 * *(float *)(uVar24 + 0x4c) +
             fVar9 * *(float *)(uVar24 + 0x7c) + fVar10 * fStack_85c;
        auVar34._4_4_ = -(uint)(ABS(auVar42._4_4_) < fVar74);
        auVar34._0_4_ = -(uint)(ABS(auVar42._0_4_) < fVar73);
        auVar34._8_4_ = -(uint)(ABS(auVar42._8_4_) < fVar75);
        auVar34._12_4_ = -(uint)(ABS(auVar42._12_4_) < fVar76);
        auVar54 = blendvps(auVar42,_DAT_01f80d30,auVar34);
        auVar41 = rcpps(auVar34,auVar86);
        fVar73 = auVar41._0_4_;
        fVar76 = auVar41._4_4_;
        fVar57 = auVar41._8_4_;
        fVar58 = auVar41._12_4_;
        fVar73 = (1.0 - auVar86._0_4_ * fVar73) * fVar73 + fVar73;
        fVar76 = (1.0 - auVar86._4_4_ * fVar76) * fVar76 + fVar76;
        fVar57 = (1.0 - auVar86._8_4_ * fVar57) * fVar57 + fVar57;
        fVar58 = (1.0 - auVar86._12_4_ * fVar58) * fVar58 + fVar58;
        auVar41 = rcpps(auVar41,auVar67);
        fVar74 = auVar41._0_4_;
        auVar62._0_4_ = auVar67._0_4_ * fVar74;
        fVar87 = auVar41._4_4_;
        auVar62._4_4_ = auVar67._4_4_ * fVar87;
        fVar88 = auVar41._8_4_;
        auVar62._8_4_ = auVar67._8_4_ * fVar88;
        fVar89 = auVar41._12_4_;
        auVar62._12_4_ = auVar67._12_4_ * fVar89;
        fVar74 = (1.0 - auVar62._0_4_) * fVar74 + fVar74;
        fVar87 = (1.0 - auVar62._4_4_) * fVar87 + fVar87;
        fVar88 = (1.0 - auVar62._8_4_) * fVar88 + fVar88;
        fVar89 = (1.0 - auVar62._12_4_) * fVar89 + fVar89;
        auVar41 = rcpps(auVar62,auVar54);
        fVar75 = auVar41._0_4_;
        fVar35 = auVar41._4_4_;
        fVar36 = auVar41._8_4_;
        fVar37 = auVar41._12_4_;
        fVar75 = (1.0 - auVar54._0_4_ * fVar75) * fVar75 + fVar75;
        fVar35 = (1.0 - auVar54._4_4_ * fVar35) * fVar35 + fVar35;
        fVar36 = (1.0 - auVar54._8_4_ * fVar36) * fVar36 + fVar36;
        fVar37 = (1.0 - auVar54._12_4_ * fVar37) * fVar37 + fVar37;
        fVar38 = *(float *)(uVar24 + 0x20) * fVar5 +
                 *(float *)(uVar24 + 0x50) * fVar6 +
                 *(float *)(uVar24 + 0x80) * fVar7 + *(float *)(uVar24 + 0xb0);
        fVar45 = *(float *)(uVar24 + 0x24) * fVar5 +
                 *(float *)(uVar24 + 0x54) * fVar6 +
                 *(float *)(uVar24 + 0x84) * fVar7 + *(float *)(uVar24 + 0xb4);
        fVar47 = *(float *)(uVar24 + 0x28) * fVar5 +
                 *(float *)(uVar24 + 0x58) * fVar6 +
                 *(float *)(uVar24 + 0x88) * fVar7 + *(float *)(uVar24 + 0xb8);
        fVar49 = *(float *)(uVar24 + 0x2c) * fVar5 +
                 *(float *)(uVar24 + 0x5c) * fVar6 +
                 *(float *)(uVar24 + 0x8c) * fVar7 + *(float *)(uVar24 + 0xbc);
        fVar39 = local_918 * fVar5 +
                 *(float *)(uVar24 + 0x60) * fVar6 +
                 *(float *)(uVar24 + 0x90) * fVar7 + *(float *)(uVar24 + 0xc0);
        fVar46 = fStack_914 * fVar5 +
                 *(float *)(uVar24 + 100) * fVar6 +
                 *(float *)(uVar24 + 0x94) * fVar7 + *(float *)(uVar24 + 0xc4);
        fVar48 = fStack_910 * fVar5 +
                 *(float *)(uVar24 + 0x68) * fVar6 +
                 *(float *)(uVar24 + 0x98) * fVar7 + *(float *)(uVar24 + 200);
        fVar50 = fStack_90c * fVar5 +
                 *(float *)(uVar24 + 0x6c) * fVar6 +
                 *(float *)(uVar24 + 0x9c) * fVar7 + *(float *)(uVar24 + 0xcc);
        fVar81 = *(float *)(uVar24 + 0x40) * fVar5 +
                 *(float *)(uVar24 + 0x70) * fVar6 + local_868 * fVar7 + *(float *)(uVar24 + 0xd0);
        fVar82 = *(float *)(uVar24 + 0x44) * fVar5 +
                 *(float *)(uVar24 + 0x74) * fVar6 + fStack_864 * fVar7 + *(float *)(uVar24 + 0xd4);
        fVar83 = *(float *)(uVar24 + 0x48) * fVar5 +
                 *(float *)(uVar24 + 0x78) * fVar6 + fStack_860 * fVar7 + *(float *)(uVar24 + 0xd8);
        fVar84 = *(float *)(uVar24 + 0x4c) * fVar5 +
                 *(float *)(uVar24 + 0x7c) * fVar6 + fStack_85c * fVar7 + *(float *)(uVar24 + 0xdc);
        fVar59 = ((*(float *)(uVar24 + 0xe0) * fVar16 + fVar70) - fVar38) * fVar73;
        fVar63 = ((*(float *)(uVar24 + 0xe4) * fVar16 + fVar70) - fVar45) * fVar76;
        fVar64 = ((*(float *)(uVar24 + 0xe8) * fVar16 + fVar70) - fVar47) * fVar57;
        fVar65 = ((*(float *)(uVar24 + 0xec) * fVar16 + fVar70) - fVar49) * fVar58;
        fVar73 = ((*(float *)(uVar24 + 0x110) * fVar16 + fVar69) - fVar38) * fVar73;
        fVar76 = ((*(float *)(uVar24 + 0x114) * fVar16 + fVar69) - fVar45) * fVar76;
        fVar57 = ((*(float *)(uVar24 + 0x118) * fVar16 + fVar69) - fVar47) * fVar57;
        fVar58 = ((*(float *)(uVar24 + 0x11c) * fVar16 + fVar69) - fVar49) * fVar58;
        fVar77 = ((*(float *)(uVar24 + 0xf0) * fVar16 + fVar70) - fVar39) * fVar74;
        fVar78 = ((*(float *)(uVar24 + 0xf4) * fVar16 + fVar70) - fVar46) * fVar87;
        fVar79 = ((*(float *)(uVar24 + 0xf8) * fVar16 + fVar70) - fVar48) * fVar88;
        fVar80 = ((*(float *)(uVar24 + 0xfc) * fVar16 + fVar70) - fVar50) * fVar89;
        fVar38 = ((fVar70 + *(float *)(uVar24 + 0x100) * fVar16) - fVar81) * fVar75;
        fVar45 = ((fVar70 + *(float *)(uVar24 + 0x104) * fVar16) - fVar82) * fVar35;
        fVar47 = ((fVar70 + *(float *)(uVar24 + 0x108) * fVar16) - fVar83) * fVar36;
        fVar49 = ((fVar70 + *(float *)(uVar24 + 0x10c) * fVar16) - fVar84) * fVar37;
        fVar74 = ((*(float *)(uVar24 + 0x120) * fVar16 + fVar69) - fVar39) * fVar74;
        fVar87 = ((*(float *)(uVar24 + 0x124) * fVar16 + fVar69) - fVar46) * fVar87;
        fVar88 = ((*(float *)(uVar24 + 0x128) * fVar16 + fVar69) - fVar48) * fVar88;
        fVar89 = ((*(float *)(uVar24 + 300) * fVar16 + fVar69) - fVar50) * fVar89;
        fVar75 = ((fVar16 * *(float *)(uVar24 + 0x130) + fVar69) - fVar81) * fVar75;
        fVar35 = ((fVar16 * *(float *)(uVar24 + 0x134) + fVar69) - fVar82) * fVar35;
        fVar36 = ((fVar16 * *(float *)(uVar24 + 0x138) + fVar69) - fVar83) * fVar36;
        fVar37 = ((fVar16 * *(float *)(uVar24 + 0x13c) + fVar69) - fVar84) * fVar37;
        auVar86._0_4_ =
             (uint)((int)fVar74 < (int)fVar77) * (int)fVar74 |
             (uint)((int)fVar74 >= (int)fVar77) * (int)fVar77;
        auVar86._4_4_ =
             (uint)((int)fVar87 < (int)fVar78) * (int)fVar87 |
             (uint)((int)fVar87 >= (int)fVar78) * (int)fVar78;
        auVar86._8_4_ =
             (uint)((int)fVar88 < (int)fVar79) * (int)fVar88 |
             (uint)((int)fVar88 >= (int)fVar79) * (int)fVar79;
        auVar86._12_4_ =
             (uint)((int)fVar89 < (int)fVar80) * (int)fVar89 |
             (uint)((int)fVar89 >= (int)fVar80) * (int)fVar80;
        auVar43._0_4_ =
             (uint)((int)fVar75 < (int)fVar38) * (int)fVar75 |
             (uint)((int)fVar75 >= (int)fVar38) * (int)fVar38;
        auVar43._4_4_ =
             (uint)((int)fVar35 < (int)fVar45) * (int)fVar35 |
             (uint)((int)fVar35 >= (int)fVar45) * (int)fVar45;
        auVar43._8_4_ =
             (uint)((int)fVar36 < (int)fVar47) * (int)fVar36 |
             (uint)((int)fVar36 >= (int)fVar47) * (int)fVar47;
        auVar43._12_4_ =
             (uint)((int)fVar37 < (int)fVar49) * (int)fVar37 |
             (uint)((int)fVar37 >= (int)fVar49) * (int)fVar49;
        auVar67 = maxps(auVar86,auVar43);
        auVar44._0_4_ =
             (uint)((int)fVar73 < (int)fVar59) * (int)fVar73 |
             (uint)((int)fVar73 >= (int)fVar59) * (int)fVar59;
        auVar44._4_4_ =
             (uint)((int)fVar76 < (int)fVar63) * (int)fVar76 |
             (uint)((int)fVar76 >= (int)fVar63) * (int)fVar63;
        auVar44._8_4_ =
             (uint)((int)fVar57 < (int)fVar64) * (int)fVar57 |
             (uint)((int)fVar57 >= (int)fVar64) * (int)fVar64;
        auVar44._12_4_ =
             (uint)((int)fVar58 < (int)fVar65) * (int)fVar58 |
             (uint)((int)fVar58 >= (int)fVar65) * (int)fVar65;
        auVar68._0_4_ =
             (uint)((int)fVar73 < (int)fVar59) * (int)fVar59 |
             (uint)((int)fVar73 >= (int)fVar59) * (int)fVar73;
        auVar68._4_4_ =
             (uint)((int)fVar76 < (int)fVar63) * (int)fVar63 |
             (uint)((int)fVar76 >= (int)fVar63) * (int)fVar76;
        auVar68._8_4_ =
             (uint)((int)fVar57 < (int)fVar64) * (int)fVar64 |
             (uint)((int)fVar57 >= (int)fVar64) * (int)fVar57;
        auVar68._12_4_ =
             (uint)((int)fVar58 < (int)fVar65) * (int)fVar65 |
             (uint)((int)fVar58 >= (int)fVar65) * (int)fVar58;
        auVar71._0_4_ =
             (uint)((int)fVar74 < (int)fVar77) * (int)fVar77 |
             (uint)((int)fVar74 >= (int)fVar77) * (int)fVar74;
        auVar71._4_4_ =
             (uint)((int)fVar87 < (int)fVar78) * (int)fVar78 |
             (uint)((int)fVar87 >= (int)fVar78) * (int)fVar87;
        auVar71._8_4_ =
             (uint)((int)fVar88 < (int)fVar79) * (int)fVar79 |
             (uint)((int)fVar88 >= (int)fVar79) * (int)fVar88;
        auVar71._12_4_ =
             (uint)((int)fVar89 < (int)fVar80) * (int)fVar80 |
             (uint)((int)fVar89 >= (int)fVar80) * (int)fVar89;
        auVar54._4_4_ = iVar15;
        auVar54._0_4_ = iVar15;
        auVar54._8_4_ = iVar15;
        auVar54._12_4_ = iVar15;
        auVar41._4_4_ =
             (uint)((int)fVar35 < (int)fVar45) * (int)fVar45 |
             (uint)((int)fVar35 >= (int)fVar45) * (int)fVar35;
        auVar41._0_4_ =
             (uint)((int)fVar75 < (int)fVar38) * (int)fVar38 |
             (uint)((int)fVar75 >= (int)fVar38) * (int)fVar75;
        auVar41._8_4_ =
             (uint)((int)fVar36 < (int)fVar47) * (int)fVar47 |
             (uint)((int)fVar36 >= (int)fVar47) * (int)fVar36;
        auVar41._12_4_ =
             (uint)((int)fVar37 < (int)fVar49) * (int)fVar49 |
             (uint)((int)fVar37 >= (int)fVar49) * (int)fVar37;
        auVar72 = minps(auVar71,auVar41);
        auVar41 = maxps(auVar55,auVar44);
        auVar55 = maxps(auVar41,auVar67);
        auVar41 = minps(auVar54,auVar68);
        auVar41 = minps(auVar41,auVar72);
LAB_00286c6d:
        bVar19 = auVar55._0_4_ <= auVar41._0_4_;
        bVar20 = auVar55._4_4_ <= auVar41._4_4_;
        bVar21 = auVar55._8_4_ <= auVar41._8_4_;
        bVar22 = auVar55._12_4_ <= auVar41._12_4_;
      }
      else {
        pfVar3 = (float *)(uVar24 + 0x80 + uVar30);
        pfVar1 = (float *)(uVar24 + 0x20 + uVar30);
        pfVar4 = (float *)(uVar24 + 0x80 + uVar27);
        pfVar2 = (float *)(uVar24 + 0x20 + uVar27);
        auVar32._0_4_ = ((*pfVar3 * fVar16 + *pfVar1) - fVar5) * fVar11;
        auVar32._4_4_ = ((pfVar3[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
        auVar32._8_4_ = ((pfVar3[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
        auVar32._12_4_ = ((pfVar3[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
        auVar40._0_4_ = ((*pfVar4 * fVar16 + *pfVar2) - fVar6) * fVar12;
        auVar40._4_4_ = ((pfVar4[1] * fVar16 + pfVar2[1]) - fVar6) * fVar12;
        auVar40._8_4_ = ((pfVar4[2] * fVar16 + pfVar2[2]) - fVar6) * fVar12;
        auVar40._12_4_ = ((pfVar4[3] * fVar16 + pfVar2[3]) - fVar6) * fVar12;
        pfVar2 = (float *)(uVar24 + 0x80 + uVar31);
        pfVar1 = (float *)(uVar24 + 0x20 + uVar31);
        auVar51._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
        auVar51._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
        auVar51._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
        auVar51._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
        auVar41 = maxps(auVar40,auVar51);
        pfVar2 = (float *)(uVar24 + 0x80 + (uVar30 ^ 0x10));
        pfVar1 = (float *)(uVar24 + 0x20 + (uVar30 ^ 0x10));
        auVar60._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar5) * fVar11;
        auVar60._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
        auVar60._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
        auVar60._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
        pfVar2 = (float *)(uVar24 + 0x80 + (uVar27 ^ 0x10));
        pfVar1 = (float *)(uVar24 + 0x20 + (uVar27 ^ 0x10));
        auVar66._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar6) * fVar12;
        auVar66._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar6) * fVar12;
        auVar66._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar6) * fVar12;
        auVar66._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar6) * fVar12;
        pfVar2 = (float *)(uVar24 + 0x80 + (uVar31 ^ 0x10));
        pfVar1 = (float *)(uVar24 + 0x20 + (uVar31 ^ 0x10));
        auVar52._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
        auVar52._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
        auVar52._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
        auVar52._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
        auVar67 = minps(auVar66,auVar52);
        auVar53._4_4_ = iVar14;
        auVar53._0_4_ = iVar14;
        auVar53._8_4_ = iVar14;
        auVar53._12_4_ = iVar14;
        auVar54 = maxps(auVar53,auVar32);
        auVar55 = maxps(auVar54,auVar41);
        auVar33._4_4_ = iVar15;
        auVar33._0_4_ = iVar15;
        auVar33._8_4_ = iVar15;
        auVar33._12_4_ = iVar15;
        auVar41 = minps(auVar33,auVar60);
        auVar41 = minps(auVar41,auVar67);
        if (uVar25 != 6) goto LAB_00286c6d;
        bVar19 = (fVar16 < *(float *)(uVar24 + 0xf0) && *(float *)(uVar24 + 0xe0) <= fVar16) &&
                 auVar55._0_4_ <= auVar41._0_4_;
        bVar20 = (fVar16 < *(float *)(uVar24 + 0xf4) && *(float *)(uVar24 + 0xe4) <= fVar16) &&
                 auVar55._4_4_ <= auVar41._4_4_;
        bVar21 = auVar55._8_4_ <= auVar41._8_4_ &&
                 (fVar16 < *(float *)(uVar24 + 0xf8) && *(float *)(uVar24 + 0xe8) <= fVar16);
        bVar22 = (fVar16 < *(float *)(uVar24 + 0xfc) && *(float *)(uVar24 + 0xec) <= fVar16) &&
                 auVar55._12_4_ <= auVar41._12_4_;
      }
      auVar56._0_4_ = (uint)bVar19 * -0x80000000;
      auVar56._4_4_ = (uint)bVar20 * -0x80000000;
      auVar56._8_4_ = (uint)bVar21 * -0x80000000;
      auVar56._12_4_ = (uint)bVar22 * -0x80000000;
      uVar25 = movmskps(uVar25,auVar56);
      if (uVar25 == 0) goto LAB_00286b72;
      uVar25 = uVar25 & 0xff;
      lVar18 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      uVar28 = *(ulong *)(uVar24 + lVar18 * 8);
      uVar25 = uVar25 - 1 & uVar25;
      if (uVar25 != 0) {
        *puVar29 = uVar28;
        puVar29 = puVar29 + 1;
        lVar18 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar28 = *(ulong *)(uVar24 + lVar18 * 8);
        uVar25 = uVar25 - 1 & uVar25;
        uVar26 = (ulong)uVar25;
        if (uVar25 != 0) {
          do {
            *puVar29 = uVar28;
            puVar29 = puVar29 + 1;
            lVar18 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar28 = *(ulong *)(uVar24 + lVar18 * 8);
            uVar26 = uVar26 & uVar26 - 1;
          } while (uVar26 != 0);
        }
      }
    }
    cVar23 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar28 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar23 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar17;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }